

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4.h
# Opt level: O0

CMatrix4<float> * __thiscall
irr::core::CMatrix4<float>::buildTextureTransform
          (CMatrix4<float> *this,f32 rotateRad,vector2df *rotatecenter,vector2df *translate,
          vector2df *scale)

{
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  CMatrix4<float> *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  f32 s;
  f32 c;
  
  fVar1 = cosf(in_XMM0_Da);
  fVar2 = sinf(in_XMM0_Da);
  in_RDI->M[0] = fVar1 * *in_RCX;
  in_RDI->M[1] = fVar2 * in_RCX[1];
  in_RDI->M[2] = 0.0;
  in_RDI->M[3] = 0.0;
  in_RDI->M[4] = -fVar2 * *in_RCX;
  in_RDI->M[5] = fVar1 * in_RCX[1];
  in_RDI->M[6] = 0.0;
  in_RDI->M[7] = 0.0;
  in_RDI->M[8] = fVar1 * *in_RCX * *in_RSI + -fVar2 * in_RSI[1] + *in_RDX;
  in_RDI->M[9] = fVar2 * in_RCX[1] * *in_RSI + fVar1 * in_RSI[1] + in_RDX[1];
  in_RDI->M[10] = 1.0;
  in_RDI->M[0xb] = 0.0;
  in_RDI->M[0xc] = 0.0;
  in_RDI->M[0xd] = 0.0;
  in_RDI->M[0xe] = 0.0;
  in_RDI->M[0xf] = 1.0;
  return in_RDI;
}

Assistant:

inline CMatrix4<T> &CMatrix4<T>::buildTextureTransform(f32 rotateRad,
		const core::vector2df &rotatecenter,
		const core::vector2df &translate,
		const core::vector2df &scale)
{
	const f32 c = cosf(rotateRad);
	const f32 s = sinf(rotateRad);

	M[0] = (T)(c * scale.X);
	M[1] = (T)(s * scale.Y);
	M[2] = 0;
	M[3] = 0;

	M[4] = (T)(-s * scale.X);
	M[5] = (T)(c * scale.Y);
	M[6] = 0;
	M[7] = 0;

	M[8] = (T)(c * scale.X * rotatecenter.X + -s * rotatecenter.Y + translate.X);
	M[9] = (T)(s * scale.Y * rotatecenter.X + c * rotatecenter.Y + translate.Y);
	M[10] = 1;
	M[11] = 0;

	M[12] = 0;
	M[13] = 0;
	M[14] = 0;
	M[15] = 1;
#if defined(USE_MATRIX_TEST)
	definitelyIdentityMatrix = false;
#endif
	return *this;
}